

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void parse_uninstall(void)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  char cVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  pointer pbVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string line;
  string file;
  fstream fin;
  value_type local_2d0;
  string local_2b0;
  string local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long *local_220 [2];
  long local_210 [60];
  
  bVar3 = Args::has_help(&args,true,true,true);
  if (bVar3) {
    help_uninstall();
    return;
  }
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"-r","");
  plVar6 = local_210;
  local_220[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"--requirement","");
  __l._M_len = 2;
  __l._M_array = &local_240;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_258,__l,(allocator_type *)&local_2b0);
  bVar3 = Args::has_option(&args,&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  lVar7 = -0x40;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  if (bVar3) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"-r","");
    plVar6 = local_210;
    local_220[0] = plVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"--requirement","");
    __l_00._M_len = 2;
    __l_00._M_array = &local_240;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_270,__l_00,(allocator_type *)&local_2d0);
    Args::get_option_value(&local_2b0,&args,&local_270);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_270);
    lVar7 = -0x40;
    do {
      if (plVar6 != (long *)plVar6[-2]) {
        operator_delete((long *)plVar6[-2],*plVar6 + 1);
      }
      plVar6 = plVar6 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    std::fstream::fstream(&local_240,(string *)&local_2b0,_S_in);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      poVar5 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._52_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"ERROR: Could not open requirements file: ",0x29);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(1);
    }
    if ((*(byte *)((long)local_220 + *(long *)(local_240._M_dataplus._M_p + -0x18)) & 2) == 0) {
      do {
        local_2d0._M_string_length = 0;
        local_2d0.field_2._M_local_buf[0] = '\0';
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_240._M_dataplus._M_p + -0x18) +
                                (char)&local_240);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_240,(string *)&local_2d0,cVar4);
        if (local_2d0._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&args.packages,&local_2d0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,
                          CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                   local_2d0.field_2._M_local_buf[0]) + 1);
        }
      } while ((*(byte *)((long)local_220 + *(long *)(local_240._M_dataplus._M_p + -0x18)) & 2) == 0
              );
    }
    std::fstream::close();
    std::fstream::~fstream(&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar2 = args.packages.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (args.packages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      args.packages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = args.packages.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar8->_M_dataplus)._M_p;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,pcVar1,pcVar1 + pbVar8->_M_string_length);
      Downloader::Uninstall((Downloader *)&local_240,&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar2);
  }
  return;
}

Assistant:

void parse_uninstall(){
    if(args.has_help()){
        help_uninstall();
    }else{
        if(args.has_option({"-r","--requirement"})){
            std::string file=args.get_option_value({"-r","--requirement"});
            std::fstream fin(file,std::ios::in);
            if(fin.is_open()==false){
                std::cout << ispring::xout.red << "ERROR: Could not open requirements file: " << file << std::endl;
                exit(1);
            }
            while(!fin.eof()){
                std::string line;
                std::getline(fin,line);
                if(line.empty())continue;
                args.packages.push_back(line);
            }
            fin.close();
        }
        for(auto&p:args.packages){
            Downloader loader;
            loader.Uninstall(p);
        }
    }
}